

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_generated.h
# Opt level: O0

Offset<MyGame::Sample::Monster>
MyGame::Sample::CreateMonster
          (FlatBufferBuilder *_fbb,Vec3 *pos,int16_t mana,int16_t hp,
          Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> inventory,Color color,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>_>
          weapons,Equipment equipped_type,Offset<void> equipped,
          Offset<flatbuffers::Vector<const_MyGame::Sample::Vec3_*,_unsigned_int>_> path)

{
  Offset<MyGame::Sample::Monster> OVar1;
  undefined1 local_50 [8];
  MonsterBuilder builder_;
  int16_t hp_local;
  int16_t mana_local;
  Vec3 *pos_local;
  FlatBufferBuilder *_fbb_local;
  Offset<flatbuffers::Vector<const_MyGame::Sample::Vec3_*,_unsigned_int>_> path_local;
  Offset<void> equipped_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>_>
  weapons_local;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> inventory_local;
  Offset<flatbuffers::String> name_local;
  
  builder_._12_2_ = hp;
  builder_._14_2_ = mana;
  MonsterBuilder::MonsterBuilder((MonsterBuilder *)local_50,_fbb);
  MonsterBuilder::add_path((MonsterBuilder *)local_50,path);
  MonsterBuilder::add_equipped((MonsterBuilder *)local_50,equipped);
  MonsterBuilder::add_weapons((MonsterBuilder *)local_50,weapons);
  MonsterBuilder::add_inventory((MonsterBuilder *)local_50,inventory);
  MonsterBuilder::add_name((MonsterBuilder *)local_50,name);
  MonsterBuilder::add_pos((MonsterBuilder *)local_50,pos);
  MonsterBuilder::add_hp((MonsterBuilder *)local_50,builder_._12_2_);
  MonsterBuilder::add_mana((MonsterBuilder *)local_50,builder_._14_2_);
  MonsterBuilder::add_equipped_type((MonsterBuilder *)local_50,equipped_type);
  MonsterBuilder::add_color((MonsterBuilder *)local_50,color);
  OVar1 = MonsterBuilder::Finish((MonsterBuilder *)local_50);
  return (Offset<MyGame::Sample::Monster>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Monster> CreateMonster(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    const MyGame::Sample::Vec3 *pos = nullptr,
    int16_t mana = 150,
    int16_t hp = 100,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> inventory = 0,
    MyGame::Sample::Color color = MyGame::Sample::Color_Blue,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Sample::Weapon>>> weapons = 0,
    MyGame::Sample::Equipment equipped_type = MyGame::Sample::Equipment_NONE,
    ::flatbuffers::Offset<void> equipped = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Sample::Vec3 *>> path = 0) {
  MonsterBuilder builder_(_fbb);
  builder_.add_path(path);
  builder_.add_equipped(equipped);
  builder_.add_weapons(weapons);
  builder_.add_inventory(inventory);
  builder_.add_name(name);
  builder_.add_pos(pos);
  builder_.add_hp(hp);
  builder_.add_mana(mana);
  builder_.add_equipped_type(equipped_type);
  builder_.add_color(color);
  return builder_.Finish();
}